

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component_import.cpp
# Opt level: O2

void __thiscall
ComponentImport_hierarchicalImportAndParse_Test::ComponentImport_hierarchicalImportAndParse_Test
          (ComponentImport_hierarchicalImportAndParse_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00133be8;
  return;
}

Assistant:

TEST(ComponentImport, hierarchicalImportAndParse)
{
    const std::string expected =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"some-other-model.xml\">\n"
        "    <component component_ref=\"cc1\" name=\"importedComponent\"/>\n"
        "  </import>\n"
        "  <component name=\"dave\"/>\n"
        "  <component name=\"bob\"/>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"dave\">\n"
        "      <component_ref component=\"bob\">\n"
        "        <component_ref component=\"importedComponent\"/>\n"
        "      </component_ref>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";

    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ImportSourcePtr imp = libcellml::ImportSource::create();
    imp->setUrl("some-other-model.xml");

    libcellml::ComponentPtr component1 = libcellml::Component::create();
    component1->setName("dave");
    m->addComponent(component1);

    libcellml::ComponentPtr component2 = libcellml::Component::create();
    component2->setName("bob");
    component1->addComponent(component2);

    EXPECT_FALSE(component1->isImport());

    libcellml::ComponentPtr importedComponent = libcellml::Component::create();
    importedComponent->setName("importedComponent");
    importedComponent->setSourceComponent(imp, "cc1");

    EXPECT_TRUE(importedComponent->isImport());

    EXPECT_EQ(size_t(0), component2->componentCount());
    component2->addComponent(importedComponent);
    EXPECT_EQ(size_t(1), component2->componentCount());

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    std::string actual = printer->printModel(m);
    EXPECT_EQ(expected, actual);

    // Parse
    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(expected);
    EXPECT_EQ(size_t(1), model->componentCount());
    EXPECT_TRUE(model->component("importedComponent", true)->isImport());
    actual = printer->printModel(model);
    EXPECT_EQ(expected, actual);
}